

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O2

QRect __thiscall QTabBarPrivate::normalizedScrollRect(QTabBarPrivate *this,int index)

{
  Shape SVar1;
  QWidget *this_00;
  QWidgetData *pQVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [12];
  LayoutDirection LVar6;
  int iVar7;
  QStyle *pQVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  Representation RVar12;
  Representation RVar13;
  uint uVar14;
  ulong uVar15;
  Representation RVar16;
  Representation RVar17;
  Representation RVar18;
  ulong uVar19;
  long in_FS_OFFSET;
  bool bVar20;
  int iVar21;
  QRect QVar22;
  QRect QVar23;
  QRect QVar24;
  QRect QVar25;
  QRect local_128;
  QRect local_118;
  QRect local_108;
  QRect local_f8;
  QRect local_e8;
  QRect local_d8;
  QRect local_c8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  if ((((this->leftB->super_QAbstractButton).super_QWidget.data)->widget_attributes & 0x10000) == 0)
  {
    memset((QStyleOptionTab *)&local_d8,0xaa,0xa0);
    QStyleOptionTab::QStyleOptionTab((QStyleOptionTab *)&local_d8);
    (**(code **)(*(long *)this_00 + 0x1c8))(this_00,(QStyleOptionTab *)&local_d8,this->currentIndex)
    ;
    local_c8 = QWidget::rect(this_00);
    pQVar8 = QWidget::style(this_00);
    QVar22 = (QRect)(**(code **)(*(long *)pQVar8 + 0xc0))
                              (pQVar8,0x35,(QStyleOptionTab *)&local_d8,this_00);
    local_e8 = QVar22;
    pQVar8 = QWidget::style(this_00);
    QVar23 = (QRect)(**(code **)(*(long *)pQVar8 + 0xc0))
                              (pQVar8,0x36,(QStyleOptionTab *)&local_d8,this_00);
    uVar9 = QVar23._0_8_;
    local_f8 = QVar23;
    pQVar8 = QWidget::style(this_00);
    QVar24 = (QRect)(**(code **)(*(long *)pQVar8 + 0xc0))
                              (pQVar8,0x18,(QStyleOptionTab *)&local_d8,this_00);
    local_108 = QVar24;
    pQVar8 = QWidget::style(this_00);
    QVar25 = (QRect)(**(code **)(*(long *)pQVar8 + 0xc0))
                              (pQVar8,0x37,(QStyleOptionTab *)&local_d8,this_00);
    RVar16 = QVar25.y1.m_i;
    RVar17 = QVar25.y2.m_i;
    local_118 = QVar25;
    if ((this->shape - RoundedWest & 0xfffffffa) == 0) {
      uVar14 = (this_00->data->crect).y2.m_i - (this_00->data->crect).y1.m_i;
      RVar13.m_i = uVar14 + 1;
      iVar7 = RVar13.m_i / 2;
      RVar18 = QVar22.y1.m_i;
      RVar12 = QVar23.y1.m_i;
      if ((RVar18.m_i < iVar7) && (RVar12.m_i < iVar7)) {
        uVar19 = (ulong)(QVar23.y2.m_i.m_i + 1);
      }
      else {
        uVar19 = 0;
        uVar15 = QVar22._0_8_;
        if (RVar18.m_i < iVar7 || RVar12.m_i < iVar7) {
          uVar15 = uVar9;
        }
        RVar13.m_i = (int)(uVar15 >> 0x20);
        if (RVar18.m_i < iVar7 || RVar12.m_i < iVar7) {
          uVar19 = (ulong)(QVar22.y2.m_i.m_i + 1);
        }
      }
      lVar3 = (this->tabList).d.size;
      if (lVar3 + -1 == (long)index) {
        bVar20 = false;
      }
      else {
        bVar20 = RVar13.m_i !=
                 (((this->tabList).d.ptr[lVar3 + -1]->rect).y2.m_i - this->scrollOffset) + 1;
      }
      if ((uint)uVar19 + this->scrollOffset != 0 && index != 0) {
        uVar11 = QVar24.y2.m_i.m_i + 1;
        if (QVar24.y1.m_i.m_i + -1 == QVar24.y2.m_i.m_i &&
            QVar24.x1.m_i.m_i + -1 == QVar24.x2.m_i.m_i) {
          uVar11 = (uint)uVar19;
        }
        uVar19 = (ulong)uVar11;
      }
      if ((bVar20) && (RVar16.m_i + -1 != RVar17.m_i || QVar25.x1.m_i.m_i + -1 != QVar25.x2.m_i.m_i)
         ) {
        RVar13.m_i = RVar16.m_i;
      }
    }
    else {
      RVar13 = QVar22.x1.m_i;
      LVar6 = QWidget::layoutDirection(this_00);
      if (LVar6 == RightToLeft) {
        local_128 = QWidget::rect(this_00);
        local_e8 = QStyle::visualRect(RightToLeft,&local_128,&local_e8);
        local_128 = QWidget::rect(this_00);
        local_f8 = QStyle::visualRect(RightToLeft,&local_128,&local_f8);
        local_128 = QWidget::rect(this_00);
        local_108 = QStyle::visualRect(RightToLeft,&local_128,&local_108);
        local_128 = QWidget::rect(this_00);
        local_118 = QStyle::visualRect(RightToLeft,&local_128,&local_118);
        auVar5 = local_118._0_12_;
        uVar9 = (ulong)(uint)local_f8.x1.m_i;
        RVar16 = local_118.y1.m_i;
        RVar17 = local_118.y2.m_i;
        RVar13.m_i = local_e8.x1.m_i;
      }
      else {
        auVar5 = QVar25._0_12_;
      }
      pQVar2 = this_00->data;
      iVar10 = ((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) + 1;
      iVar7 = iVar10 / 2;
      iVar21 = (int)uVar9;
      if ((RVar13.m_i < iVar7) && (iVar21 < iVar7)) {
        uVar19 = (ulong)(local_f8.x2.m_i + 1);
        RVar13.m_i = iVar10;
      }
      else if ((RVar13.m_i < iVar7) || (uVar19 = 0, iVar21 < iVar7)) {
        uVar19 = (ulong)(local_e8.x2.m_i + 1);
        RVar13.m_i = iVar21;
      }
      iVar7 = (uint)uVar19 + this->scrollOffset;
      lVar3 = (this->tabList).d.size;
      if (lVar3 + -1 == (long)index) {
        bVar20 = false;
      }
      else {
        bVar20 = RVar13.m_i !=
                 (((this->tabList).d.ptr[lVar3 + -1]->rect).x2.m_i - this->scrollOffset) + 1;
      }
      if (iVar7 != 0 && index != 0) {
        iVar10 = -(uint)(local_108.x1.m_i.m_i + -1 == local_108.x2.m_i.m_i);
        iVar21 = -(uint)(local_108.y1.m_i.m_i + -1 == local_108.y2.m_i.m_i);
        auVar4._4_4_ = iVar10;
        auVar4._0_4_ = iVar10;
        auVar4._8_4_ = iVar21;
        auVar4._12_4_ = iVar21;
        iVar7 = movmskpd(CONCAT31((int3)((uint)iVar7 >> 8),iVar7 != 0 && index != 0),auVar4);
        uVar14 = local_108.x2.m_i.m_i + 1;
        if (iVar7 == 3) {
          uVar14 = (uint)uVar19;
        }
        uVar19 = (ulong)uVar14;
      }
      if ((bVar20) && (RVar17.m_i != RVar16.m_i + -1 || auVar5._8_4_ != auVar5._0_4_ + -1)) {
        RVar13.m_i = auVar5._0_4_;
      }
      uVar14 = (pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i;
    }
    uVar15 = (ulong)uVar14;
    QVar22.x2.m_i = RVar13.m_i + -1;
    QVar22.x1.m_i = (int)uVar19;
    QVar22.y1.m_i = (int)(uVar19 >> 0x20);
    QVar22.y2.m_i = 0;
    QStyleOptionTab::~QStyleOptionTab((QStyleOptionTab *)&local_d8);
    uVar9 = 0;
  }
  else {
    SVar1 = this->shape;
    QVar22 = QWidget::rect(this_00);
    if ((SVar1 - RoundedWest & 0xfffffffa) == 0) {
      local_d8 = QVar22;
      QVar22 = QRect::transposed(&local_d8);
    }
    uVar9 = QVar22._0_8_ & 0xffffffff00000000;
    uVar15 = QVar22._8_8_ >> 0x20;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  QVar23._0_8_ = uVar9 | QVar22._0_8_ & 0xffffffff;
  QVar23._8_8_ = QVar22._8_8_ & 0xffffffff | uVar15 << 0x20;
  return QVar23;
}

Assistant:

QRect QTabBarPrivate::normalizedScrollRect(int index)
{
    // "Normalized scroll rect" means return the free space on the tab bar
    // that doesn't overlap with scroll buttons or tear indicators, and
    // always return the rect as horizontal Qt::LeftToRight, even if the
    // tab bar itself is in a different orientation.

    Q_Q(QTabBar);
    // If scrollbuttons are not visible, then there's no tear either, and
    // the entire widget is the scroll rect.
    if (leftB->isHidden())
        return verticalTabs(shape) ? q->rect().transposed() : q->rect();

    QStyleOptionTab opt;
    q->initStyleOption(&opt, currentIndex);
    opt.rect = q->rect();

    QRect scrollButtonLeftRect = q->style()->subElementRect(QStyle::SE_TabBarScrollLeftButton, &opt, q);
    QRect scrollButtonRightRect = q->style()->subElementRect(QStyle::SE_TabBarScrollRightButton, &opt, q);
    QRect tearLeftRect = q->style()->subElementRect(QStyle::SE_TabBarTearIndicatorLeft, &opt, q);
    QRect tearRightRect = q->style()->subElementRect(QStyle::SE_TabBarTearIndicatorRight, &opt, q);

    if (verticalTabs(shape)) {
        int topEdge, bottomEdge;
        bool leftButtonIsOnTop = scrollButtonLeftRect.y() < q->height() / 2;
        bool rightButtonIsOnTop = scrollButtonRightRect.y() < q->height() / 2;

        if (leftButtonIsOnTop && rightButtonIsOnTop) {
            topEdge = scrollButtonRightRect.bottom() + 1;
            bottomEdge = q->height();
        } else if (!leftButtonIsOnTop && !rightButtonIsOnTop) {
            topEdge = 0;
            bottomEdge = scrollButtonLeftRect.top();
        } else {
            topEdge = scrollButtonLeftRect.bottom() + 1;
            bottomEdge = scrollButtonRightRect.top();
        }

        bool tearTopVisible = index != 0 && topEdge != -scrollOffset;
        bool tearBottomVisible = index != tabList.size() - 1 && bottomEdge != tabList.constLast()->rect.bottom() + 1 - scrollOffset;
        if (tearTopVisible && !tearLeftRect.isNull())
            topEdge = tearLeftRect.bottom() + 1;
        if (tearBottomVisible && !tearRightRect.isNull())
            bottomEdge = tearRightRect.top();

        return QRect(topEdge, 0, bottomEdge - topEdge, q->height());
    } else {
        if (q->layoutDirection() == Qt::RightToLeft) {
            scrollButtonLeftRect = QStyle::visualRect(Qt::RightToLeft, q->rect(), scrollButtonLeftRect);
            scrollButtonRightRect = QStyle::visualRect(Qt::RightToLeft, q->rect(), scrollButtonRightRect);
            tearLeftRect = QStyle::visualRect(Qt::RightToLeft, q->rect(), tearLeftRect);
            tearRightRect = QStyle::visualRect(Qt::RightToLeft, q->rect(), tearRightRect);
        }

        int leftEdge, rightEdge;
        bool leftButtonIsOnLeftSide = scrollButtonLeftRect.x() < q->width() / 2;
        bool rightButtonIsOnLeftSide = scrollButtonRightRect.x() < q->width() / 2;

        if (leftButtonIsOnLeftSide && rightButtonIsOnLeftSide) {
            leftEdge = scrollButtonRightRect.right() + 1;
            rightEdge = q->width();
        } else if (!leftButtonIsOnLeftSide && !rightButtonIsOnLeftSide) {
            leftEdge = 0;
            rightEdge = scrollButtonLeftRect.left();
        } else {
            leftEdge = scrollButtonLeftRect.right() + 1;
            rightEdge = scrollButtonRightRect.left();
        }

        bool tearLeftVisible = index != 0 && leftEdge != -scrollOffset;
        bool tearRightVisible = index != tabList.size() - 1 && rightEdge != tabList.constLast()->rect.right() + 1 - scrollOffset;
        if (tearLeftVisible && !tearLeftRect.isNull())
            leftEdge = tearLeftRect.right() + 1;
        if (tearRightVisible && !tearRightRect.isNull())
            rightEdge = tearRightRect.left();

        return QRect(leftEdge, 0, rightEdge - leftEdge, q->height());
    }
}